

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::validateKVD(ValidationContext *this)

{
  string_view text;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view string;
  string_view string_00;
  string_view string_01;
  int iVar1;
  bool bVar2;
  uint uVar3;
  pointer puVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  issue;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  _Var5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  _Var6;
  pointer ppVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  long *in_RDI;
  optional<unsigned_long> oVar11;
  pair<std::__detail::_Node_iterator<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>,_bool>
  pVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_false,_true>,_bool>
  pVar13;
  undefined1 auVar14 [16];
  iterator it;
  KeyValueEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
  kvValidators;
  optional<unsigned_long> invalidIndex;
  uint32_t sizeValue;
  uchar *ptrValue;
  string_view key;
  bool keyHasNullTerminator;
  uint32_t sizeKey;
  long bytesLeft;
  uchar *ptrKey;
  uchar *ptrKeyValuePair;
  uint32_t sizeKeyValuePair;
  long remainingKVDBytes;
  uchar *ptrEntry;
  uint32_t numKVEntry;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  keys;
  vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> entries;
  uchar *ptrKVDEnd;
  uchar *ptrKVD;
  __array buffer;
  ktx_uint32_t kvdByteLength;
  ktx_uint32_t kvdByteOffset;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
  *in_stack_fffffffffffffb88;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
  *in_stack_fffffffffffffb90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb98;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> *in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  IssueError *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  char *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  ValidationContext *in_stack_fffffffffffffbe0;
  unsigned_long *in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  IssueError *in_stack_fffffffffffffc30;
  ValidationContext *in_stack_fffffffffffffc38;
  ValidationContext *this_01;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  ValidationContext *in_stack_fffffffffffffc48;
  int local_398;
  long *in_stack_fffffffffffffcb0;
  uint *in_stack_fffffffffffffcb8;
  IssueWarning *in_stack_fffffffffffffcc0;
  ValidationContext *in_stack_fffffffffffffcc8;
  IssueWarning *in_stack_fffffffffffffcd0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  in_stack_fffffffffffffcd8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_320;
  reference local_318;
  KeyValueEntry *local_310;
  __normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
  local_308;
  undefined1 *local_300;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_2f8;
  undefined1 local_2f0;
  code *local_2e8;
  undefined8 local_2e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_2d8;
  undefined1 local_2d0;
  code *local_2c8;
  undefined8 local_2c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_2b8;
  undefined1 local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_298;
  undefined1 local_290;
  code *local_288;
  undefined8 local_280;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_278;
  undefined1 local_270;
  code *local_268;
  undefined8 local_260;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_258;
  undefined1 local_250;
  code *local_248;
  undefined8 local_240;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_238;
  undefined1 local_230;
  code *local_228;
  undefined8 local_220;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_218;
  undefined1 local_210;
  code *local_208;
  undefined8 local_200;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_1f8;
  undefined1 local_1f0;
  code *local_1e8;
  undefined8 local_1e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
  local_1d8;
  undefined1 local_1d0;
  code *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [104];
  byte local_150;
  ktxIndexEntry32 local_148;
  byte local_140;
  _Optional_payload_base<_khr_df_model_e> local_138;
  _Storage<std::array<unsigned_char,_8UL>,_true> local_130;
  _Storage<unsigned_long,_true> local_128;
  undefined1 local_120;
  _Optional_payload_base<_khr_df_model_e> local_108;
  _Storage<std::array<unsigned_char,_8UL>,_true> local_100;
  int local_f4;
  long local_f0;
  undefined1 local_e8 [32];
  _Optional_payload_base<_khr_df_model_e> local_c8;
  _Optional_payload_base<_khr_df_model_e> local_c0;
  _Storage<_khr_df_transfer_e,_true> local_b8;
  uint local_b4;
  long local_b0;
  _khr_df_transfer_e *local_a8;
  uint local_9c;
  undefined1 local_60 [24];
  _khr_df_transfer_e *local_48;
  _khr_df_transfer_e *local_40;
  undefined8 local_28;
  undefined8 local_20;
  uint local_10;
  int local_c;
  
  local_c = (int)in_RDI[0xe];
  local_10 = *(uint *)((long)in_RDI + 0x74);
  if ((local_c != 0) && (local_10 != 0)) {
    std::make_unique<unsigned_char[]>(CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8))
    ;
    iVar1 = local_c;
    puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        in_stack_fffffffffffffb90);
    uVar3 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba0._M_cur,
               (char *)in_stack_fffffffffffffb98);
    (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,puVar4,uVar3,local_28,local_20);
    local_40 = (_khr_df_transfer_e *)
               std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_fffffffffffffb90);
    local_48 = (_khr_df_transfer_e *)((long)local_40 + (ulong)local_10);
    std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>::vector
              ((vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> *)0x2b36a8);
    std::
    unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::unordered_set((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)0x2b36b5);
    local_9c = 0;
    local_a8 = local_40;
    while (local_a8 < local_48) {
      local_b0 = (long)local_48 - (long)local_a8;
      uVar3 = local_9c + 1;
      if (100 < uVar3) {
        local_b4 = local_9c;
        local_9c = uVar3;
        warning<unsigned_int,long_const&>
                  (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                   in_stack_fffffffffffffcb0);
        local_a8 = local_48;
        break;
      }
      if (local_b0 < 6) {
        local_9c = uVar3;
        error<long_const&>(in_stack_fffffffffffffc48,
                           (IssueError *)
                           CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                           (long *)in_stack_fffffffffffffc38);
        local_a8 = local_48;
        break;
      }
      local_b8._M_value = *local_a8;
      local_c8 = (_Optional_payload_base<_khr_df_model_e>)(local_a8 + 1);
      local_c0 = local_c8;
      if ((uint)local_b8 < KHR_DF_TRANSFER_SCRGB) {
        local_9c = uVar3;
        error<unsigned_int&>
                  (in_stack_fffffffffffffc48,
                   (IssueError *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                   (uint *)in_stack_fffffffffffffc38);
      }
      else {
        local_9c = uVar3;
        if (local_48 < (_khr_df_transfer_e *)((long)local_c8 + (ulong)local_b8._M_value)) {
          local_e8._24_8_ = (long)local_48 - (long)local_c8;
          error<unsigned_int&,long_const&>
                    (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                     (uint *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                     (long *)in_stack_fffffffffffffc20);
          local_b8._M_value = (_khr_df_transfer_e)local_e8._24_8_;
        }
        local_e8._20_4_ = 0;
        while( true ) {
          bVar2 = false;
          if ((uint)local_e8._20_4_ < local_b8._M_value) {
            bVar2 = *(char *)((long)local_c8 + (ulong)(uint)local_e8._20_4_) != '\0';
          }
          if (!bVar2) break;
          local_e8._20_4_ = local_e8._20_4_ + 1;
        }
        if (local_e8._20_4_ == 0) {
          error<>(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
        }
        else {
          local_e8[0x13] = local_e8._20_4_ != local_b8._M_value;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_e8,(char *)local_c8,
                     (ulong)(uint)local_e8._20_4_);
          local_f0 = (long)local_c8 + (ulong)(uint)local_e8._20_4_ + 1;
          if ((local_e8[0x13] & 1) == 0) {
            local_398 = 0;
          }
          else {
            local_398 = (local_b8._M_value - local_e8._20_4_) + -1;
          }
          local_f4 = local_398;
          local_108._M_payload = (_Storage<_khr_df_model_e,_true>)local_e8._0_4_;
          local_108._M_engaged = (bool)local_e8[4];
          local_108._5_3_ = local_e8._5_3_;
          local_100 = (_Storage<std::array<unsigned_char,_8UL>,_true>)local_e8._8_8_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffffba0._M_cur,(char *)in_stack_fffffffffffffb98);
          string._M_len._7_1_ = in_stack_fffffffffffffbcf;
          string._M_len._0_7_ = in_stack_fffffffffffffbc8;
          string._M_str = in_stack_fffffffffffffbd0;
          prefix._M_len._7_1_ = in_stack_fffffffffffffbbf;
          prefix._M_len._0_7_ = in_stack_fffffffffffffbb8;
          prefix._M_str = (char *)in_stack_fffffffffffffbc0;
          bVar2 = starts_with(string,prefix);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_e8,3);
            error<std::basic_string_view<char,std::char_traits<char>>&>
                      (in_stack_fffffffffffffc48,
                       (IssueError *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc38
                      );
          }
          local_138._M_payload = (_Storage<_khr_df_model_e,_true>)local_e8._0_4_;
          local_138._M_engaged = (bool)local_e8[4];
          local_138._5_3_ = local_e8._5_3_;
          local_130 = (_Storage<std::array<unsigned_char,_8UL>,_true>)local_e8._8_8_;
          text._M_len._7_1_ = in_stack_fffffffffffffbaf;
          text._M_len._0_7_ = in_stack_fffffffffffffba8;
          text._M_str = (char *)in_stack_fffffffffffffbb0;
          oVar11 = validateUTF8(text);
          local_128._M_value =
               oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          local_120 = oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged;
          bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x2b3aa6);
          if (bVar2) {
            std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x2b3ab9);
            error<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&>
                      (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
          }
          if ((local_e8[0x13] & 1) == 0) {
            error<std::basic_string_view<char,std::char_traits<char>>&>
                      (in_stack_fffffffffffffc48,
                       (IssueError *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc38
                      );
          }
          std::
          vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>
          ::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>&,unsigned_char_const*&,unsigned_int_const&>
                    (in_stack_fffffffffffffbb0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                     (uchar **)in_stack_fffffffffffffba0._M_cur,(uint *)in_stack_fffffffffffffb98);
          pVar12 = std::
                   unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                   ::emplace<std::basic_string_view<char,std::char_traits<char>>&>
                             ((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)in_stack_fffffffffffffba0._M_cur,in_stack_fffffffffffffb98);
          local_1b8._96_8_ =
               pVar12.first.
               super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
               ._M_cur;
          local_150 = pVar12.second;
          local_148 = (ktxIndexEntry32)local_1b8._96_8_;
          local_140 = local_150;
          if (((local_150 ^ 0xff) & 1) != 0) {
            error<std::basic_string_view<char,std::char_traits<char>>&>
                      (in_stack_fffffffffffffc48,
                       (IssueError *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc38
                      );
          }
        }
      }
      local_a8 = (_khr_df_transfer_e *)((ulong)local_b8._M_value + 4 + (long)local_a8);
      validateAlignmentPaddingZeros<char_const(&)[24]>
                (in_stack_fffffffffffffbe0,
                 (void *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                 in_stack_fffffffffffffbd0,
                 CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                 in_stack_fffffffffffffbc0,
                 (char (*) [24])CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      local_a8 = (_khr_df_transfer_e *)
                 align<unsigned_char_const>
                           ((uchar *)in_stack_fffffffffffffb90,(uintptr_t)in_stack_fffffffffffffb88)
      ;
    }
    if (local_a8 != local_48) {
      local_1b8._88_8_ = (long)local_a8 - (long)local_40;
      error<long,unsigned_int_const&>
                (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                 (long *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                 (uint *)in_stack_fffffffffffffc20);
    }
    if (in_RDI[0x10] != 0) {
      validateAlignmentPaddingZeros<char_const(&)[25]>
                (in_stack_fffffffffffffbe0,
                 (void *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                 in_stack_fffffffffffffbd0,
                 CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                 in_stack_fffffffffffffbc0,
                 (char (*) [25])CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    }
    local_1b8._72_4_ = 0;
    local_1b8._76_4_ = 0;
    bVar2 = is_sorted<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>
                      (in_stack_fffffffffffffbb0,
                       (less<void> *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                       (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                        *)in_stack_fffffffffffffba0._M_cur);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      error<>(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      local_1b8[0x38] = '\0';
      local_1b8[0x39] = '\0';
      local_1b8[0x3a] = '\0';
      local_1b8[0x3b] = '\0';
      local_1b8[0x3c] = '\0';
      local_1b8[0x3d] = '\0';
      local_1b8[0x3e] = '\0';
      local_1b8[0x3f] = '\0';
      sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>
                (in_stack_fffffffffffffbb0,
                 (less<void> *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                 (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  *)in_stack_fffffffffffffba0._M_cur);
    }
    this_01 = (ValidationContext *)local_1b8;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                     *)0x2b3d63);
    local_1c8 = validateKTXcubemapIncomplete;
    local_1c0 = 0;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[21],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [21])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    this_00._M_cur =
         (__node_type *)
         pVar13.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
         ._M_cur;
    uVar8 = pVar13.second;
    local_1e8 = validateKTXorientation;
    local_1e0 = 0;
    local_1d8._M_cur = this_00._M_cur;
    local_1d0 = uVar8;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[15],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [15])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    issue._M_cur = (__node_type *)
                   pVar13.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                   ._M_cur;
    local_1f0 = pVar13.second;
    local_208 = validateKTXglFormat;
    local_200 = 0;
    local_1f8._M_cur = issue._M_cur;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[12],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [12])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    local_218._M_cur =
         (__node_type *)
         pVar13.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
         ._M_cur;
    local_210 = pVar13.second;
    local_228 = validateKTXdxgiFormat;
    local_220 = 0;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[16],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [16])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    local_238._M_cur =
         (__node_type *)
         pVar13.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
         ._M_cur;
    local_230 = pVar13.second;
    local_248 = validateKTXmetalPixelFormat;
    local_240 = 0;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[20],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [20])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    local_258._M_cur =
         (__node_type *)
         pVar13.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
         ._M_cur;
    local_250 = pVar13.second;
    local_268 = validateKTXswizzle;
    local_260 = 0;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[11],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [11])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    local_278._M_cur =
         (__node_type *)
         pVar13.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
         ._M_cur;
    local_270 = pVar13.second;
    local_288 = validateKTXwriter;
    local_280 = 0;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[10],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [10])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    local_298._M_cur =
         (__node_type *)
         pVar13.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
         ._M_cur;
    local_290 = pVar13.second;
    local_2a8 = validateKTXwriterScParams;
    local_2a0 = 0;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[18],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [18])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    _Var5._M_cur = (__node_type *)
                   pVar13.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                   ._M_cur;
    uVar9 = pVar13.second;
    local_2c8 = validateKTXastcDecodeMode;
    local_2c0 = 0;
    local_2b8._M_cur = _Var5._M_cur;
    local_2b0 = uVar9;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[18],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [18])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    _Var6._M_cur = (__node_type *)
                   pVar13.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                   ._M_cur;
    uVar10 = pVar13.second;
    local_2e8 = validateKTXanimData;
    local_2e0 = 0;
    local_2d8._M_cur = _Var6._M_cur;
    local_2d0 = uVar10;
    pVar13 = std::
             unordered_map<std::__cxx11::string,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>>
             ::
             emplace<char_const(&)[12],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                         *)in_stack_fffffffffffffba0._M_cur,(char (*) [12])in_stack_fffffffffffffb98
                        ,(type *)in_stack_fffffffffffffb90);
    local_2f8._M_cur =
         (__node_type *)
         pVar13.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
         ._M_cur;
    local_2f0 = pVar13.second;
    local_300 = local_60;
    local_308._M_current =
         (KeyValueEntry *)
         std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>::begin
                   ((vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> *)
                    in_stack_fffffffffffffb88);
    local_310 = (KeyValueEntry *)
                std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>::end
                          ((vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> *)
                           in_stack_fffffffffffffb88);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                               *)in_stack_fffffffffffffb90,
                              (__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                               *)in_stack_fffffffffffffb88), bVar2) {
      local_318 = __gnu_cxx::
                  __normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                  ::operator*(&local_308);
      in_stack_fffffffffffffba0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
           ::find(in_stack_fffffffffffffb88,(key_type *)0x2b4199);
      local_320._M_cur = in_stack_fffffffffffffba0._M_cur;
      in_stack_fffffffffffffcd8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
           ::end(in_stack_fffffffffffffb88);
      bVar2 = std::__detail::operator!=
                        (&local_320,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                          *)&stack0xfffffffffffffcd8);
      if (bVar2) {
        ppVar7 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_false,_true>
                               *)0x2b41ed);
        in_stack_fffffffffffffb90 =
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
              *)ppVar7->second;
        in_stack_fffffffffffffb98 =
             (basic_string_view<char,_std::char_traits<char>_> *)
             ((long)in_RDI + *(long *)&ppVar7->field_0x28);
        in_stack_fffffffffffffb88 = in_stack_fffffffffffffb90;
        if (((ulong)in_stack_fffffffffffffb90 & 1) != 0) {
          in_stack_fffffffffffffb88 =
               *(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                 **)((long)in_stack_fffffffffffffb90 + (in_stack_fffffffffffffb98->_M_len - 1));
        }
        (*(code *)in_stack_fffffffffffffb88)
                  (in_stack_fffffffffffffb98,local_318->data,local_318->size);
      }
      else {
        auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_318);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffffba0._M_cur,(char *)in_stack_fffffffffffffb98);
        string_00._M_len._7_1_ = uVar9;
        string_00._M_len._0_7_ = in_stack_fffffffffffffbc8;
        string_00._M_str = (char *)_Var5._M_cur;
        prefix_00._M_len._7_1_ = uVar10;
        prefix_00._M_len._0_7_ = in_stack_fffffffffffffbb8;
        prefix_00._M_str = (char *)_Var6._M_cur;
        bVar2 = starts_with(string_00,prefix_00);
        in_stack_fffffffffffffcd0 = auVar14._8_8_;
        if (!bVar2) {
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_318);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffffba0._M_cur,(char *)in_stack_fffffffffffffb98);
          string_01._M_len._7_1_ = uVar9;
          string_01._M_len._0_7_ = in_stack_fffffffffffffbc8;
          string_01._M_str = (char *)_Var5._M_cur;
          prefix_01._M_len._7_1_ = uVar10;
          prefix_01._M_len._0_7_ = in_stack_fffffffffffffbb8;
          prefix_01._M_str = (char *)_Var6._M_cur;
          bVar2 = starts_with(string_01,prefix_01);
          in_stack_fffffffffffffcd0 = auVar14._8_8_;
          if (!bVar2) {
            warning<std::__cxx11::string_const&>
                      ((ValidationContext *)in_stack_fffffffffffffcd8._M_cur,
                       in_stack_fffffffffffffcd0,auVar14._0_8_);
            goto LAB_002b437a;
          }
        }
        error<std::__cxx11::string_const&>
                  ((ValidationContext *)this_00._M_cur,
                   (IssueError *)CONCAT17(uVar8,in_stack_fffffffffffffc40),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      }
LAB_002b437a:
      __gnu_cxx::
      __normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
      ::operator++(&local_308);
    }
    if (((*(byte *)(in_RDI + 0x22) & 1) != 0) && ((*(byte *)((long)in_RDI + 0x112) & 1) != 0)) {
      error<>(this_01,(IssueError *)issue._M_cur);
    }
    if ((*(byte *)(in_RDI + 0x23) & 1) == 0) {
      if ((*(byte *)((long)in_RDI + 0x119) & 1) == 0) {
        warning<>((ValidationContext *)in_stack_fffffffffffffcd8._M_cur,in_stack_fffffffffffffcd0);
      }
      else {
        error<>(this_01,(IssueError *)issue._M_cur);
      }
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
                      *)0x2b4429);
    std::
    unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~unordered_set((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x2b4436);
    std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>::~vector
              ((vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> *)
               in_stack_fffffffffffffba0._M_cur);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               in_stack_fffffffffffffb90);
  }
  return;
}

Assistant:

void ValidationContext::validateKVD() {
    const auto kvdByteOffset = header.keyValueData.byteOffset;
    const auto kvdByteLength = header.keyValueData.byteLength;

    if (kvdByteOffset == 0 || kvdByteLength == 0)
        return; // There is no KVD block

    const auto buffer = std::make_unique<uint8_t[]>(kvdByteLength);
    read(kvdByteOffset, buffer.get(), kvdByteLength, "the Key/Value Data");
    const auto* ptrKVD = buffer.get();
    const auto* ptrKVDEnd = ptrKVD + kvdByteLength;

    struct KeyValueEntry {
        std::string key;
        const uint8_t* data;
        uint32_t size;

        KeyValueEntry(std::string_view key, const uint8_t* data, uint32_t size) :
                key(key), data(data), size(size) {}
    };
    std::vector<KeyValueEntry> entries;
    std::unordered_set<std::string_view> keys;

    uint32_t numKVEntry = 0;
    // Process Key-Value entries {size, key, \0, value} until the end of the KVD block
    // Where size is an uint32_t, and it equals to: sizeof(key) + 1 + sizeof(value)
    const auto* ptrEntry = ptrKVD;
    while (ptrEntry < ptrKVDEnd) {
        const auto remainingKVDBytes = ptrKVDEnd - ptrEntry;

        if (++numKVEntry > MAX_NUM_KV_ENTRIES) {
            warning(Metadata::TooManyEntries, numKVEntry - 1, remainingKVDBytes);
            ptrEntry = ptrKVDEnd;
            break;
        }

        if (remainingKVDBytes < 6) {
            error(Metadata::NotEnoughDataForAnEntry, remainingKVDBytes);
            ptrEntry = ptrKVDEnd;
            break;
        }

        uint32_t sizeKeyValuePair;
        std::memcpy(&sizeKeyValuePair, ptrEntry, sizeof(uint32_t));

        const auto* ptrKeyValuePair = ptrEntry + sizeof(uint32_t);
        const auto* ptrKey = ptrKeyValuePair;

        if (sizeKeyValuePair < 2) {
            error(Metadata::KeyAndValueByteLengthTooSmall, sizeKeyValuePair);
        } else {
            if (ptrKeyValuePair + sizeKeyValuePair > ptrKVDEnd) {
                const auto bytesLeft = ptrKVDEnd - ptrKeyValuePair;
                error(Metadata::KeyAndValueByteLengthTooLarge, sizeKeyValuePair, bytesLeft);
                sizeKeyValuePair = static_cast<uint32_t>(bytesLeft); // Attempt recovery to read out at least the key
            }

            // Determine key, finding the null terminator
            uint32_t sizeKey = 0;
            while (sizeKey < sizeKeyValuePair && ptrKey[sizeKey] != '\0')
                ++sizeKey;

            if (sizeKey == 0) {
                error(Metadata::KeyEmpty);
            } else {
                const auto keyHasNullTerminator = sizeKey != sizeKeyValuePair;
                auto key = std::string_view(reinterpret_cast<const char*>(ptrKey), sizeKey);

                // Determine the value
                const auto* ptrValue = ptrKey + sizeKey + 1;
                const auto sizeValue = keyHasNullTerminator ? sizeKeyValuePair - sizeKey - 1 : 0;

                // Check for BOM
                if (starts_with(key, "\xEF\xBB\xBF")) {
                    key.remove_prefix(3);
                    error(Metadata::KeyForbiddenBOM, key);
                }

                if (auto invalidIndex = validateUTF8(key))
                    error(Metadata::KeyInvalidUTF8, key, *invalidIndex);

                if (!keyHasNullTerminator)
                    error(Metadata::KeyMissingNullTerminator, key);

                entries.emplace_back(key, ptrValue, sizeValue);

                if (!keys.emplace(key).second)
                    error(Metadata::DuplicateKey, key);
            }
        }

        // Finish entry
        ptrEntry += sizeof(uint32_t) + sizeKeyValuePair;
        validateAlignmentPaddingZeros(ptrEntry, ptrKVDEnd, 4, Metadata::PaddingNotZero, "after a Key-Value entry");
        ptrEntry = align(ptrEntry, 4);
    }

    if (ptrEntry != ptrKVDEnd)
        // Being super explicit about the specs. This check might be overkill as other checks often cover this case
        error(Metadata::SizesDontAddUp, ptrEntry - ptrKVD, kvdByteLength);

    if (header.supercompressionGlobalData.byteLength != 0)
        validateAlignmentPaddingZeros(ptrEntry, ptrKVDEnd, 8, Metadata::PaddingNotZero, "after the last KVD entry");

    if (!is_sorted(entries, std::less<>{}, &KeyValueEntry::key)) {
        error(Metadata::OutOfOrder);
        sort(entries, std::less<>{}, &KeyValueEntry::key);
    }

    using MemberFN = void(ValidationContext::*)(const uint8_t*, uint32_t);
    std::unordered_map<std::string, MemberFN> kvValidators;

    kvValidators.emplace("KTXcubemapIncomplete", &ValidationContext::validateKTXcubemapIncomplete);
    kvValidators.emplace("KTXorientation", &ValidationContext::validateKTXorientation);
    kvValidators.emplace("KTXglFormat", &ValidationContext::validateKTXglFormat);
    kvValidators.emplace("KTXdxgiFormat__", &ValidationContext::validateKTXdxgiFormat);
    kvValidators.emplace("KTXmetalPixelFormat", &ValidationContext::validateKTXmetalPixelFormat);
    kvValidators.emplace("KTXswizzle", &ValidationContext::validateKTXswizzle);
    kvValidators.emplace("KTXwriter", &ValidationContext::validateKTXwriter);
    kvValidators.emplace("KTXwriterScParams", &ValidationContext::validateKTXwriterScParams);
    kvValidators.emplace("KTXastcDecodeMode", &ValidationContext::validateKTXastcDecodeMode);
    kvValidators.emplace("KTXanimData", &ValidationContext::validateKTXanimData);

    for (const auto& entry : entries) {
        const auto it = kvValidators.find(entry.key);
        if (it != kvValidators.end()) {
            (this->*it->second)(entry.data, entry.size);
        } else {
            if (starts_with(entry.key, "KTX") || starts_with(entry.key, "ktx"))
                error(Metadata::UnknownReservedKey, entry.key);
            else
                warning(Metadata::CustomMetadata, entry.key);
        }
    }

    if (foundKTXanimData && foundKTXcubemapIncomplete)
        error(Metadata::KTXanimDataWithCubeIncomplete);

    if (!foundKTXwriter) {
        if (foundKTXwriterScParams)
            error(Metadata::KTXwriterRequiredButMissing);
        else
            warning(Metadata::KTXwriterMissing);
    }
}